

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeCamera.cpp
# Opt level: O2

void __thiscall fw::FreeCamera::moveRelatively(FreeCamera *this,vec3 *movement)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  vec3 vVar6;
  vec3 vVar7;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  anon_union_12_3_e2189aaa_for_tvec3<float,_(glm::precision)0>_2 local_20;
  
  fVar1 = (movement->field_0).field_0.z;
  vVar6 = getWorldForwardDirection(this);
  fVar2 = (movement->field_0).field_0.x;
  fVar3 = (movement->field_0).field_0.y;
  uVar5 = *(undefined8 *)&(this->_upDirection).field_0;
  fVar4 = (this->_upDirection).field_0.field_0.z;
  vVar7 = getWorldRightDirection(this);
  local_20.field_0.z = vVar7.field_0._8_4_ * fVar2 + fVar4 * fVar3 + vVar6.field_0._8_4_ * fVar1;
  local_38 = vVar6.field_0._0_4_;
  fStack_34 = vVar6.field_0._4_4_;
  local_48 = (float)uVar5;
  fStack_44 = (float)((ulong)uVar5 >> 0x20);
  local_20._0_8_ =
       CONCAT44(fVar2 * vVar7.field_0._4_4_ + fVar3 * fStack_44 + fVar1 * fStack_34,
                fVar2 * vVar7.field_0._0_4_ + fVar3 * local_48 + fVar1 * local_38);
  glm::tvec3<float,(glm::precision)0>::operator+=
            ((tvec3<float,(glm::precision)0> *)this,
             (tvec3<float,_(glm::precision)0> *)&local_20.field_0);
  return;
}

Assistant:

void FreeCamera::moveRelatively(const glm::vec3& movement)
{
    auto relativeMovement =
        movement.z * getWorldForwardDirection()
        + movement.y * getWorldUpDirection()
        + movement.x * getWorldRightDirection();

    _worldPosition += relativeMovement;
}